

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall
mjs::parser::parse_expression1(parser *this,expression_ptr *lhs,int outer_precedence)

{
  undefined8 args_1;
  bool bVar1;
  version vVar2;
  type e;
  wostream *pwVar3;
  identifier_expression *this_00;
  wstring *this_01;
  token_type in_ECX;
  undefined4 in_register_00000014;
  wchar_t *in_R9;
  undefined1 auVar4 [16];
  wstring_view message;
  bool local_2b9;
  undefined1 local_2b8 [16];
  version local_2a8;
  token_type local_2a4;
  int look_ahead_precedence;
  token_type look_ahead;
  expression_ptr rhs;
  source_extend local_268;
  mjs local_250 [16];
  wstring local_240;
  wostringstream local_220 [8];
  wostringstream _oss;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_a8;
  undefined1 local_a0 [64];
  undefined1 local_60 [8];
  expression_ptr l;
  token_type local_2c;
  int precedence;
  token_type op;
  anon_class_1_1_a85bef83 prec;
  undefined8 uStack_20;
  int outer_precedence_local;
  expression_ptr *lhs_local;
  parser *this_local;
  
  uStack_20 = CONCAT44(in_register_00000014,outer_precedence);
  local_2b9 = true;
  if (((ulong)lhs[0xf]._M_t.
              super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
              super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
              super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl & 0x100) == 0) {
    local_2b9 = *(int *)&lhs[2]._M_t.
                         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                         .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl < 1;
  }
  precedence._3_1_ = local_2b9;
  op = in_ECX;
  do {
    while( true ) {
      local_2c = current_token_type((parser *)lhs);
      vVar2 = parse_expression1::anon_class_1_1_a85bef83::operator()
                        ((anon_class_1_1_a85bef83 *)((long)&precedence + 3),local_2c);
      if ((int)op < (int)vVar2) {
        std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
                  ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this,
                   (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)uStack_20);
        return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
               (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
               this;
      }
      get_token((token *)&l,(parser *)lhs);
      token::~token((token *)&l);
      if (local_2c != question) break;
      parse_assignment_expression((parser *)local_60);
      expect((token *)(local_a0 + 0x18),(parser *)lhs,colon,"parse_expression1",0x259);
      token::~token((token *)(local_a0 + 0x18));
      args_1 = uStack_20;
      parse_assignment_expression((parser *)&local_a8);
      make_expression<mjs::conditional_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_a0,lhs,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)args_1,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_60);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)uStack_20,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_a0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_a0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                (&local_a8);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_60);
    }
    if ((((ulong)lhs[0xc]._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl & 1) != 0) &&
       (bVar1 = is_assignment_op(local_2c), bVar1)) {
      e = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                    ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)uStack_20
                    );
      bVar1 = is_strict_mode_unassignable_identifier(e);
      if (bVar1) {
        std::__cxx11::wostringstream::wostringstream(local_220);
        pwVar3 = std::operator<<((wostream *)local_220,"\"");
        this_00 = (identifier_expression *)
                  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                            ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                             uStack_20);
        this_01 = identifier_expression::id_abi_cxx11_(this_00);
        local_250 = (mjs  [16])
                    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)this_01);
        cpp_quote_abi_cxx11_(&local_240,local_250,local_250._8_8_);
        pwVar3 = std::operator<<(pwVar3,(wstring *)&local_240);
        std::operator<<(pwVar3,"\" may not be assigned in strict mode");
        std::__cxx11::wstring::~wstring((wstring *)&local_240);
        current_extend(&local_268,(parser *)lhs);
        std::__cxx11::wostringstream::str();
        auVar4 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&rhs);
        message._M_str = in_R9;
        message._M_len = auVar4._8_8_;
        syntax_error((parser *)"parse_expression1",(char *)0x25e,(int)&local_268,auVar4._0_8_,
                     message);
      }
    }
    parse_unary_expression((parser *)&look_ahead_precedence);
    while( true ) {
      local_2a4 = current_token_type((parser *)lhs);
      local_2a8 = parse_expression1::anon_class_1_1_a85bef83::operator()
                            ((anon_class_1_1_a85bef83 *)((long)&precedence + 3),local_2a4);
      if (((int)vVar2 < (int)local_2a8) ||
         ((local_2a8 == vVar2 && (bVar1 = is_right_to_left(local_2a4), !bVar1)))) break;
      parse_expression1((parser *)(local_2b8 + 8),lhs,(int)&look_ahead_precedence);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 &look_ahead_precedence,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_2b8 + 8));
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_2b8 + 8));
    }
    make_expression<mjs::binary_expression,mjs::token_type_const&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_2b8,(token_type *)lhs,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               &stack0xffffffffffffffd4,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)uStack_20);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)uStack_20,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_2b8);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_2b8);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               &look_ahead_precedence);
  } while( true );
}

Assistant:

expression_ptr parse_expression1(expression_ptr&& lhs, int outer_precedence) {
        auto prec = [no_in=supress_in_ || version_ < version::es3](token_type t) { return !no_in || t != token_type::in_ ? operator_precedence(t) : 100; };

        for (;;) {
            const auto op = current_token_type();
            const auto precedence = prec(op);
            if (precedence > outer_precedence) {
                break;
            }
            get_token();
            if (op == token_type::question) {
                auto l = parse_assignment_expression();
                EXPECT(token_type::colon);
                lhs = make_expression<conditional_expression>(std::move(lhs), std::move(l), parse_assignment_expression());
                continue;
            }
            if (strict_mode_ && is_assignment_op(op) && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be assigned in strict mode");
            }

            auto rhs = parse_unary_expression();
            for (;;) {
                const auto look_ahead = current_token_type();
                const auto look_ahead_precedence = prec(look_ahead);
                if (look_ahead_precedence > precedence || (look_ahead_precedence == precedence && !is_right_to_left(look_ahead))) {
                    break;
                }
                rhs = parse_expression1(std::move(rhs), look_ahead_precedence);
            }

            lhs = make_expression<binary_expression>(op, std::move(lhs), std::move(rhs));
        }
        return std::move(lhs);
    }